

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapshotExtractor.cpp
# Opt level: O1

void __thiscall
TTD::SnapshotExtractor::EvacuateMarkedIntoSnapshot
          (SnapshotExtractor *this,ThreadContext *threadContext,
          BaseHashSet<Js::FunctionBody_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::FunctionBody_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
          *liveTopLevelBodies)

{
  undefined1 *puVar1;
  TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapType::SnapType_*> *this_00;
  uint uVar2;
  uint uVar3;
  uint32 uVar4;
  SnapShot *this_01;
  uint64 uVar5;
  FrameDisplay *environment;
  ThreadContextTTD *this_02;
  TTD_LOG_PTR_ID origId;
  ThreadContext *pTVar6;
  bool bVar7;
  MarkTableTag MVar8;
  int32 iVar9;
  SlabAllocator *alloc;
  List<Js::ScriptContext_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *pLVar10;
  ScriptContext **ppSVar11;
  Type *pTVar12;
  UnorderedArrayList<TTD::NSSnapValues::SnapContext,_32UL> *this_03;
  SnapContext *snapCtx;
  SlabAllocator *alloc_00;
  BaseDictionary<Js::HashedCharacterBuffer<char16_t>_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *dictionary;
  UnorderedArrayList<int,_32UL> *this_04;
  int *piVar13;
  EntryType *pEVar14;
  SnapObject *sobj;
  FunctionBodyResolveInfo *fbInfo;
  SnapPrimitiveValue *snapValue;
  UnorderedArrayList<TTD::NSSnapValues::SnapRootInfoEntry,_512UL> *this_05;
  SnapRootInfoEntry *pSVar15;
  EntryType *pEVar16;
  ScriptContext *pSVar17;
  long lVar18;
  int32 i;
  int iVar19;
  double dVar20;
  undefined1 auStack_158 [8];
  BaseDictionary<Js::RecyclableObject_*,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  objToLogIdMap;
  undefined1 auStack_118 [8];
  TTDTimer timer;
  undefined1 local_f8 [8];
  List<TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  topLevelNewFunction;
  List<TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  topLevelEval;
  List<TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  topLevelScriptLoad;
  int local_44;
  FunctionBody *local_40;
  FunctionBody *body;
  
  auStack_118 = (undefined1  [8])0x0;
  timer.m_timer.data.cacheTick = 0;
  timer.m_timer.data.cacheSysTime = -NAN;
  timer.m_timer.data.previousDifference =
       (ULONGLONG)PlatformAgnostic::DateTime::HiResTimer::Now((HiResTimer *)auStack_118);
  this_01 = this->m_pendingSnap;
  alloc = SnapShot::GetSnapshotSlabAllocator(this_01);
  auStack_158 = (undefined1  [8])0x0;
  objToLogIdMap.buckets = (Type)0x0;
  objToLogIdMap.entries = (Type)&Memory::HeapAllocator::Instance;
  objToLogIdMap.alloc = (Type)0x0;
  objToLogIdMap.size = 0;
  objToLogIdMap.count = 0;
  objToLogIdMap.freeList = 0x4b;
  objToLogIdMap.freeCount = 0;
  objToLogIdMap.modFunctionIndex = 0;
  body = (FunctionBody *)threadContext;
  ThreadContextTTD::LoadInvertedRootMap
            (threadContext->TTDContext,
             (BaseDictionary<Js::RecyclableObject_*,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              *)auStack_158);
  puVar1 = &topLevelScriptLoad.field_0x28;
  for (local_44 = 0;
      pLVar10 = ThreadContextTTD::GetTTDContexts
                          (*(ThreadContextTTD **)&body[0xb].executionState.initDebuggerMode),
      local_44 <
      (pLVar10->super_ReadOnlyList<Js::ScriptContext_*,_Memory::HeapAllocator,_DefaultComparer>).
      count; local_44 = local_44 + 1) {
    topLevelScriptLoad.
    super_ReadOnlyList<TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DefaultComparer>
    ._vptr_ReadOnlyList = (_func_int **)0x0;
    topLevelScriptLoad.
    super_ReadOnlyList<TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DefaultComparer>
    .buffer._0_4_ = 0;
    topLevelScriptLoad.
    super_ReadOnlyList<TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DefaultComparer>
    ._16_8_ = &Memory::HeapAllocator::Instance;
    topLevelEval._40_8_ = &PTR_IsReadOnly_014fe220;
    topLevelScriptLoad.
    super_ReadOnlyList<TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DefaultComparer>
    .alloc = (Type)0x400000000;
    topLevelNewFunction.
    super_ReadOnlyList<TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DefaultComparer>
    ._vptr_ReadOnlyList = (_func_int **)0x0;
    topLevelNewFunction.
    super_ReadOnlyList<TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DefaultComparer>
    .buffer._0_4_ = 0;
    topLevelNewFunction.
    super_ReadOnlyList<TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DefaultComparer>
    ._16_8_ = &Memory::HeapAllocator::Instance;
    local_f8 = (undefined1  [8])&PTR_IsReadOnly_014fe220;
    topLevelNewFunction.
    super_ReadOnlyList<TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DefaultComparer>
    .alloc = (Type)0x400000000;
    topLevelEval.
    super_ReadOnlyList<TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DefaultComparer>
    ._vptr_ReadOnlyList = (_func_int **)0x0;
    topLevelEval.
    super_ReadOnlyList<TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DefaultComparer>
    .buffer._0_4_ = 0;
    topLevelEval.
    super_ReadOnlyList<TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DefaultComparer>
    ._16_8_ = &Memory::HeapAllocator::Instance;
    topLevelNewFunction._40_8_ = &PTR_IsReadOnly_014fe220;
    topLevelEval.
    super_ReadOnlyList<TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DefaultComparer>
    .alloc = (Type)0x400000000;
    pLVar10 = ThreadContextTTD::GetTTDContexts
                        (*(ThreadContextTTD **)&body[0xb].executionState.initDebuggerMode);
    ppSVar11 = JsUtil::ReadOnlyList<Js::ScriptContext_*,_Memory::HeapAllocator,_DefaultComparer>::
               Item(&pLVar10->
                     super_ReadOnlyList<Js::ScriptContext_*,_Memory::HeapAllocator,_DefaultComparer>
                    ,local_44);
    ScriptContextTTD::GetLoadedSources
              ((*ppSVar11)->TTDContextInfo,
               (BaseHashSet<Js::FunctionBody_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::FunctionBody_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                *)0x0,(List<TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                       *)&topLevelEval.field_0x28,
               (List<TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                *)local_f8,
               (List<TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                *)&topLevelNewFunction.field_0x28);
    if (0 < (int)topLevelScriptLoad.
                 super_ReadOnlyList<TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DefaultComparer>
                 .buffer) {
      iVar19 = 0;
      do {
        pTVar12 = JsUtil::
                  List<TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  ::Item((List<TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                          *)&topLevelEval.field_0x28,iVar19);
        local_40 = (FunctionBody *)pTVar12->ContextSpecificBodyPtrId;
        iVar9 = MarkTable::FindIndexForKey(&this->m_marks,(uint64)local_40);
        if ((this->m_marks).m_markArray[iVar9] != Clear) {
          topLevelScriptLoad._40_8_ = local_40;
          JsUtil::
          BaseDictionary<Js::FunctionBody*,Js::FunctionBody*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
          ::
          Insert<(JsUtil::BaseDictionary<Js::FunctionBody*,Js::FunctionBody*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>::InsertOperations)0>
                    ((BaseDictionary<Js::FunctionBody*,Js::FunctionBody*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
                      *)liveTopLevelBodies,(FunctionBody **)puVar1,&local_40);
          iVar9 = MarkTable::FindIndexForKey(&this->m_marks,(uint64)local_40);
          (this->m_marks).m_markArray[iVar9] = Clear;
        }
        iVar19 = iVar19 + 1;
      } while (iVar19 < (int)topLevelScriptLoad.
                             super_ReadOnlyList<TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DefaultComparer>
                             .buffer);
    }
    if (0 < (int)topLevelNewFunction.
                 super_ReadOnlyList<TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DefaultComparer>
                 .buffer) {
      iVar19 = 0;
      do {
        pTVar12 = JsUtil::
                  List<TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  ::Item((List<TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                          *)local_f8,iVar19);
        local_40 = (FunctionBody *)pTVar12->ContextSpecificBodyPtrId;
        iVar9 = MarkTable::FindIndexForKey(&this->m_marks,(uint64)local_40);
        if ((this->m_marks).m_markArray[iVar9] != Clear) {
          topLevelScriptLoad._40_8_ = local_40;
          JsUtil::
          BaseDictionary<Js::FunctionBody*,Js::FunctionBody*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
          ::
          Insert<(JsUtil::BaseDictionary<Js::FunctionBody*,Js::FunctionBody*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>::InsertOperations)0>
                    ((BaseDictionary<Js::FunctionBody*,Js::FunctionBody*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
                      *)liveTopLevelBodies,(FunctionBody **)puVar1,&local_40);
          iVar9 = MarkTable::FindIndexForKey(&this->m_marks,(uint64)local_40);
          (this->m_marks).m_markArray[iVar9] = Clear;
        }
        iVar19 = iVar19 + 1;
      } while (iVar19 < (int)topLevelNewFunction.
                             super_ReadOnlyList<TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DefaultComparer>
                             .buffer);
    }
    if (0 < (int)topLevelEval.
                 super_ReadOnlyList<TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DefaultComparer>
                 .buffer) {
      iVar19 = 0;
      do {
        pTVar12 = JsUtil::
                  List<TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  ::Item((List<TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                          *)&topLevelNewFunction.field_0x28,iVar19);
        local_40 = (FunctionBody *)pTVar12->ContextSpecificBodyPtrId;
        iVar9 = MarkTable::FindIndexForKey(&this->m_marks,(uint64)local_40);
        if ((this->m_marks).m_markArray[iVar9] != Clear) {
          topLevelScriptLoad._40_8_ = local_40;
          JsUtil::
          BaseDictionary<Js::FunctionBody*,Js::FunctionBody*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
          ::
          Insert<(JsUtil::BaseDictionary<Js::FunctionBody*,Js::FunctionBody*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>::InsertOperations)0>
                    ((BaseDictionary<Js::FunctionBody*,Js::FunctionBody*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
                      *)liveTopLevelBodies,(FunctionBody **)puVar1,&local_40);
          iVar9 = MarkTable::FindIndexForKey(&this->m_marks,(uint64)local_40);
          (this->m_marks).m_markArray[iVar9] = Clear;
        }
        iVar19 = iVar19 + 1;
      } while (iVar19 < (int)topLevelEval.
                             super_ReadOnlyList<TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DefaultComparer>
                             .buffer);
    }
    topLevelNewFunction._40_8_ = &PTR_IsReadOnly_014fe220;
    if (topLevelEval.
        super_ReadOnlyList<TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DefaultComparer>
        ._vptr_ReadOnlyList != (_func_int **)0x0) {
      Memory::HeapAllocator::Free
                ((HeapAllocator *)
                 topLevelEval.
                 super_ReadOnlyList<TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DefaultComparer>
                 ._16_8_,topLevelEval.
                         super_ReadOnlyList<TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DefaultComparer>
                         ._vptr_ReadOnlyList,
                 (long)(int)topLevelEval.
                            super_ReadOnlyList<TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DefaultComparer>
                            .alloc << 4);
      topLevelEval.
      super_ReadOnlyList<TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DefaultComparer>
      ._vptr_ReadOnlyList = (_func_int **)0x0;
      topLevelEval.
      super_ReadOnlyList<TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DefaultComparer>
      .buffer._0_4_ = 0;
      topLevelEval.
      super_ReadOnlyList<TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DefaultComparer>
      .alloc = (Type)((ulong)topLevelEval.
                             super_ReadOnlyList<TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DefaultComparer>
                             .alloc & 0xffffffff00000000);
    }
    local_f8 = (undefined1  [8])&PTR_IsReadOnly_014fe220;
    if (topLevelNewFunction.
        super_ReadOnlyList<TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DefaultComparer>
        ._vptr_ReadOnlyList != (_func_int **)0x0) {
      Memory::HeapAllocator::Free
                ((HeapAllocator *)
                 topLevelNewFunction.
                 super_ReadOnlyList<TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DefaultComparer>
                 ._16_8_,topLevelNewFunction.
                         super_ReadOnlyList<TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DefaultComparer>
                         ._vptr_ReadOnlyList,
                 (long)(int)topLevelNewFunction.
                            super_ReadOnlyList<TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DefaultComparer>
                            .alloc << 4);
      topLevelNewFunction.
      super_ReadOnlyList<TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DefaultComparer>
      ._vptr_ReadOnlyList = (_func_int **)0x0;
      topLevelNewFunction.
      super_ReadOnlyList<TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DefaultComparer>
      .buffer._0_4_ = 0;
      topLevelNewFunction.
      super_ReadOnlyList<TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DefaultComparer>
      .alloc = (Type)((ulong)topLevelNewFunction.
                             super_ReadOnlyList<TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DefaultComparer>
                             .alloc & 0xffffffff00000000);
    }
    topLevelEval._40_8_ = &PTR_IsReadOnly_014fe220;
    if (topLevelScriptLoad.
        super_ReadOnlyList<TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DefaultComparer>
        ._vptr_ReadOnlyList != (_func_int **)0x0) {
      Memory::HeapAllocator::Free
                ((HeapAllocator *)
                 topLevelScriptLoad.
                 super_ReadOnlyList<TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DefaultComparer>
                 ._16_8_,topLevelScriptLoad.
                         super_ReadOnlyList<TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DefaultComparer>
                         ._vptr_ReadOnlyList,
                 (long)(int)topLevelScriptLoad.
                            super_ReadOnlyList<TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DefaultComparer>
                            .alloc << 4);
      topLevelScriptLoad.
      super_ReadOnlyList<TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DefaultComparer>
      ._vptr_ReadOnlyList = (_func_int **)0x0;
      topLevelScriptLoad.
      super_ReadOnlyList<TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DefaultComparer>
      .buffer._0_4_ = 0;
      topLevelScriptLoad.
      super_ReadOnlyList<TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DefaultComparer>
      .alloc = (Type)((ulong)topLevelScriptLoad.
                             super_ReadOnlyList<TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DefaultComparer>
                             .alloc & 0xffffffff00000000);
    }
  }
  this_03 = SnapShot::GetContextList(this->m_pendingSnap);
  for (iVar19 = 0;
      pLVar10 = ThreadContextTTD::GetTTDContexts
                          (*(ThreadContextTTD **)&body[0xb].executionState.initDebuggerMode),
      iVar19 < (pLVar10->
               super_ReadOnlyList<Js::ScriptContext_*,_Memory::HeapAllocator,_DefaultComparer>).
               count; iVar19 = iVar19 + 1) {
    snapCtx = UnorderedArrayList<TTD::NSSnapValues::SnapContext,_32UL>::NextOpenEntry(this_03);
    pLVar10 = ThreadContextTTD::GetTTDContexts
                        (*(ThreadContextTTD **)&body[0xb].executionState.initDebuggerMode);
    ppSVar11 = JsUtil::ReadOnlyList<Js::ScriptContext_*,_Memory::HeapAllocator,_DefaultComparer>::
               Item(&pLVar10->
                     super_ReadOnlyList<Js::ScriptContext_*,_Memory::HeapAllocator,_DefaultComparer>
                    ,iVar19);
    pSVar17 = *ppSVar11;
    alloc_00 = SnapShot::GetSnapshotSlabAllocator(this_01);
    NSSnapValues::ExtractScriptContext
              (snapCtx,pSVar17,
               (BaseDictionary<Js::RecyclableObject_*,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                *)auStack_158,liveTopLevelBodies,alloc_00);
  }
  dictionary = ThreadContext::GetSymbolRegistrationMap_TTD((ThreadContext *)body);
  this_04 = SnapShot::GetTCSymbolMapInfoList(this->m_pendingSnap);
  JsUtil::
  BaseDictionary<Js::HashedCharacterBuffer<char16_t>_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::
  EntryIterator<JsUtil::BaseDictionary<Js::HashedCharacterBuffer<char16_t>_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
  ::EntryIterator((EntryIterator<JsUtil::BaseDictionary<Js::HashedCharacterBuffer<char16_t>_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                   *)&topLevelEval.field_0x28,dictionary);
  puVar1 = &topLevelEval.field_0x28;
  while (bVar7 = JsUtil::
                 BaseDictionary<Js::HashedCharacterBuffer<char16_t>_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                 ::
                 EntryIterator<JsUtil::BaseDictionary<Js::HashedCharacterBuffer<char16_t>_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                 ::IsValid((EntryIterator<JsUtil::BaseDictionary<Js::HashedCharacterBuffer<char16_t>_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                            *)puVar1), bVar7) {
    piVar13 = UnorderedArrayList<int,_32UL>::NextOpenEntry(this_04);
    pEVar14 = JsUtil::
              BaseDictionary<Js::HashedCharacterBuffer<char16_t>_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              ::
              IteratorBase<JsUtil::BaseDictionary<Js::HashedCharacterBuffer<char16_t>_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<Js::HashedCharacterBuffer<char16_t>_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseDictionary<Js::HashedCharacterBuffer<char16_t>_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
              ::Current((IteratorBase<JsUtil::BaseDictionary<Js::HashedCharacterBuffer<char16_t>_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<Js::HashedCharacterBuffer<char16_t>_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseDictionary<Js::HashedCharacterBuffer<char16_t>_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
                         *)puVar1);
    *piVar13 = ((pEVar14->
                super_DefaultHashedEntry<Memory::WriteBarrierPtr<Js::HashedCharacterBuffer<char16_t>_>,_Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                ).
                super_KeyValueEntry<Memory::WriteBarrierPtr<Js::HashedCharacterBuffer<char16_t>_>,_Memory::WriteBarrierPtr<const_Js::PropertyRecord>_>
                .
                super_ValueEntry<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<Js::HashedCharacterBuffer<char16_t>_>,_Memory::WriteBarrierPtr<const_Js::PropertyRecord>_>_>
                .
                super_KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<Js::HashedCharacterBuffer<char16_t>_>,_Memory::WriteBarrierPtr<const_Js::PropertyRecord>_>
                .value.ptr)->pid;
    JsUtil::
    BaseDictionary<Js::HashedCharacterBuffer<char16_t>_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::
    EntryIterator<JsUtil::BaseDictionary<Js::HashedCharacterBuffer<char16_t>_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
    ::MoveNext((EntryIterator<JsUtil::BaseDictionary<Js::HashedCharacterBuffer<char16_t>_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                *)puVar1);
  }
  TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapType::SnapHandler_*>::Initialize
            (&this->m_idToHandlerMap,(this->m_marks).m_handlerCounts[1]);
  this_00 = &this->m_idToTypeMap;
  TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapType::SnapType_*>::Initialize
            (this_00,(this->m_marks).m_handlerCounts[2]);
  MarkTable::InitializeIter(&this->m_marks);
  uVar2 = (this->m_marks).m_iterPos;
  pTVar6 = (ThreadContext *)body;
  if (uVar2 < (this->m_marks).m_capcity) {
    MVar8 = (this->m_marks).m_markArray[uVar2];
  }
  else {
    MVar8 = Clear;
  }
  do {
    body = (FunctionBody *)pTVar6;
    if (MVar8 == Clear) {
      this_02 = pTVar6->TTDContext;
      this_05 = SnapShot::GetRootList(this->m_pendingSnap);
      JsUtil::
      BaseDictionary<unsigned_long,_Js::RecyclableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
      ::
      EntryIterator<const_JsUtil::BaseDictionary<unsigned_long,_Js::RecyclableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
      ::EntryIterator((EntryIterator<const_JsUtil::BaseDictionary<unsigned_long,_Js::RecyclableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                       *)&topLevelEval.field_0x28,&pTVar6->TTDContext->m_ttdRootTagToObjectMap);
      puVar1 = &topLevelEval.field_0x28;
      while (bVar7 = JsUtil::
                     BaseDictionary<unsigned_long,_Js::RecyclableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                     ::
                     EntryIterator<const_JsUtil::BaseDictionary<unsigned_long,_Js::RecyclableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                     ::IsValid((EntryIterator<const_JsUtil::BaseDictionary<unsigned_long,_Js::RecyclableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                                *)puVar1), bVar7) {
        pSVar15 = UnorderedArrayList<TTD::NSSnapValues::SnapRootInfoEntry,_512UL>::NextOpenEntry
                            (this_05);
        pEVar16 = JsUtil::
                  BaseDictionary<unsigned_long,_Js::RecyclableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                  ::
                  IteratorBase<const_JsUtil::BaseDictionary<unsigned_long,_Js::RecyclableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<unsigned_long,_Js::RecyclableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<const_JsUtil::BaseDictionary<unsigned_long,_Js::RecyclableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
                  ::Current((IteratorBase<const_JsUtil::BaseDictionary<unsigned_long,_Js::RecyclableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<unsigned_long,_Js::RecyclableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<const_JsUtil::BaseDictionary<unsigned_long,_Js::RecyclableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
                             *)puVar1);
        pSVar15->LogObject =
             (TTD_PTR_ID)
             (pEVar16->
             super_DefaultHashedEntry<unsigned_long,_Js::RecyclableObject_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
             ).super_KeyValueEntry<unsigned_long,_Js::RecyclableObject_*>.
             super_ValueEntry<Js::RecyclableObject_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_long,_Js::RecyclableObject_*>_>
             .super_KeyValueEntryDataLayout2<unsigned_long,_Js::RecyclableObject_*>.value;
        pEVar16 = JsUtil::
                  BaseDictionary<unsigned_long,_Js::RecyclableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                  ::
                  IteratorBase<const_JsUtil::BaseDictionary<unsigned_long,_Js::RecyclableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<unsigned_long,_Js::RecyclableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<const_JsUtil::BaseDictionary<unsigned_long,_Js::RecyclableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
                  ::Current((IteratorBase<const_JsUtil::BaseDictionary<unsigned_long,_Js::RecyclableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<unsigned_long,_Js::RecyclableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<const_JsUtil::BaseDictionary<unsigned_long,_Js::RecyclableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
                             *)puVar1);
        origId = (pEVar16->
                 super_DefaultHashedEntry<unsigned_long,_Js::RecyclableObject_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                 ).super_KeyValueEntry<unsigned_long,_Js::RecyclableObject_*>.
                 super_ValueEntry<Js::RecyclableObject_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_long,_Js::RecyclableObject_*>_>
                 .super_KeyValueEntryDataLayout2<unsigned_long,_Js::RecyclableObject_*>.key;
        pSVar15->LogId = origId;
        bVar7 = ThreadContextTTD::ResolveIsLongLivedForExtract(this_02,origId);
        pSVar15->MaybeLongLivedRoot = bVar7;
        JsUtil::
        BaseDictionary<unsigned_long,_Js::RecyclableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
        ::
        EntryIterator<const_JsUtil::BaseDictionary<unsigned_long,_Js::RecyclableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
        ::MoveNext((EntryIterator<const_JsUtil::BaseDictionary<unsigned_long,_Js::RecyclableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                    *)puVar1);
      }
      pSVar17 = ThreadContextTTD::GetActiveScriptContext
                          (*(ThreadContextTTD **)&body[0xb].executionState.initDebuggerMode);
      if (pSVar17 == (ScriptContext *)0x0) {
        SnapShot::SetActiveScriptContext(this->m_pendingSnap,0);
      }
      else {
        pSVar17 = ThreadContextTTD::GetActiveScriptContext
                            (*(ThreadContextTTD **)&body[0xb].executionState.initDebuggerMode);
        SnapShot::SetActiveScriptContext(this->m_pendingSnap,pSVar17->ScriptContextLogTag);
      }
      dVar20 = PlatformAgnostic::DateTime::HiResTimer::Now((HiResTimer *)auStack_118);
      this_01->ExtractTime = (dVar20 - (double)timer.m_timer.data.previousDifference) / 1000.0;
      JsUtil::
      BaseDictionary<Js::RecyclableObject_*,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
      ::~BaseDictionary((BaseDictionary<Js::RecyclableObject_*,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                         *)auStack_158);
      return;
    }
    switch(MVar8 & AllKindMask) {
    case TypeHandlerTag:
      ExtractHandlerIfNeeded
                (this,(DynamicTypeHandler *)(this->m_marks).m_addrArray[(this->m_marks).m_iterPos],
                 pTVar6);
      break;
    case TypeTag:
      ExtractTypeIfNeeded(this,(Type *)(this->m_marks).m_addrArray[(this->m_marks).m_iterPos],pTVar6
                         );
      break;
    case PrimitiveObjectTag:
      ExtractTypeIfNeeded(this,*(Type **)((this->m_marks).m_addrArray[(this->m_marks).m_iterPos] + 8
                                         ),pTVar6);
      snapValue = SnapShot::GetNextAvailablePrimitiveObjectEntry(this_01);
      uVar2 = (this->m_marks).m_iterPos;
      NSSnapValues::ExtractSnapPrimitiveValue
                (snapValue,(RecyclableObject *)(this->m_marks).m_addrArray[uVar2],
                 (bool)(((this->m_marks).m_markArray[uVar2] & JsWellKnownObj) >> 4),this_00,alloc);
      break;
    case CompoundObjectTag:
      ExtractTypeIfNeeded(this,*(Type **)((this->m_marks).m_addrArray[(this->m_marks).m_iterPos] + 8
                                         ),pTVar6);
      bVar7 = Js::VarIs<Js::ScriptFunction,Js::RecyclableObject>
                        ((RecyclableObject *)(this->m_marks).m_addrArray[(this->m_marks).m_iterPos])
      ;
      if (bVar7) {
        uVar5 = (this->m_marks).m_addrArray[(this->m_marks).m_iterPos];
        environment = *(FrameDisplay **)(uVar5 + 0x30);
        if (environment->length != 0) {
          ExtractScopeIfNeeded
                    (this,*(ScriptContext **)(*(long *)(*(long *)(uVar5 + 8) + 8) + 0x490),
                     environment);
        }
      }
      sobj = SnapShot::GetNextAvailableCompoundObjectEntry(this_01);
      uVar2 = (this->m_marks).m_iterPos;
      NSSnapObjects::ExtractCompoundObject
                (sobj,(RecyclableObject *)(this->m_marks).m_addrArray[uVar2],
                 (bool)(((this->m_marks).m_markArray[uVar2] & JsWellKnownObj) >> 4),this_00,alloc);
      break;
    case FunctionBodyTag:
      fbInfo = SnapShot::GetNextAvailableFunctionBodyResolveInfoEntry(this_01);
      uVar2 = (this->m_marks).m_iterPos;
      NSSnapValues::ExtractFunctionBodyInfo
                (fbInfo,(FunctionBody *)(this->m_marks).m_addrArray[uVar2],
                 (bool)(((this->m_marks).m_markArray[uVar2] & JsWellKnownObj) >> 4),alloc);
      break;
    case EnvironmentTag:
    case SlotArrayTag:
      break;
    default:
      TTDAbort_unrecoverable_error("If this isn\'t true then we have an unknown tag");
    }
    uVar3 = (this->m_marks).m_capcity;
    uVar4 = (this->m_marks).m_iterPos;
    uVar2 = uVar4 + 1;
    (this->m_marks).m_iterPos = uVar2;
    if (uVar2 < uVar3) {
      lVar18 = 0;
      do {
        if (((this->m_marks).m_markArray[lVar18 + (ulong)uVar2] & AllKindMask) != Clear) break;
        (this->m_marks).m_iterPos = uVar4 + 2 + (int)lVar18;
        lVar18 = lVar18 + 1;
      } while ((ulong)uVar3 - (ulong)uVar2 != lVar18);
    }
    uVar2 = (this->m_marks).m_iterPos;
    pTVar6 = (ThreadContext *)body;
    if (uVar2 < uVar3) {
      MVar8 = (this->m_marks).m_markArray[uVar2];
    }
    else {
      MVar8 = Clear;
    }
  } while( true );
}

Assistant:

void SnapshotExtractor::EvacuateMarkedIntoSnapshot(ThreadContext* threadContext, JsUtil::BaseHashSet<Js::FunctionBody*, HeapAllocator>& liveTopLevelBodies)
    {
        TTDTimer timer;
        double startTime = timer.Now();

        SnapShot* snap = this->m_pendingSnap;
        SlabAllocator& alloc = this->m_pendingSnap->GetSnapshotSlabAllocator();

        //invert the root map for extracting
        JsUtil::BaseDictionary<Js::RecyclableObject*, TTD_LOG_PTR_ID, HeapAllocator> objToLogIdMap(&HeapAllocator::Instance);
        threadContext->TTDContext->LoadInvertedRootMap(objToLogIdMap);

        //We extract all the global code function bodies with the context so clear their marks now
        for (int32 i = 0; i < threadContext->TTDContext->GetTTDContexts().Count(); ++i)
        {
            JsUtil::List<TopLevelFunctionInContextRelation, HeapAllocator> topLevelScriptLoad(&HeapAllocator::Instance);
            JsUtil::List<TopLevelFunctionInContextRelation, HeapAllocator> topLevelNewFunction(&HeapAllocator::Instance);
            JsUtil::List<TopLevelFunctionInContextRelation, HeapAllocator> topLevelEval(&HeapAllocator::Instance);

            Js::ScriptContext* ctx = threadContext->TTDContext->GetTTDContexts().Item(i);
            ctx->TTDContextInfo->GetLoadedSources(nullptr, topLevelScriptLoad, topLevelNewFunction, topLevelEval);

            for (int32 j = 0; j < topLevelScriptLoad.Count(); ++j)
            {
                Js::FunctionBody* body = TTD_COERCE_PTR_ID_TO_FUNCTIONBODY(topLevelScriptLoad.Item(j).ContextSpecificBodyPtrId);
                if (this->m_marks.IsMarked(body))
                {
                    liveTopLevelBodies.Add(body);
                    this->m_marks.ClearMark(body);
                }
            }

            for (int32 j = 0; j < topLevelNewFunction.Count(); ++j)
            {
                Js::FunctionBody* body = TTD_COERCE_PTR_ID_TO_FUNCTIONBODY(topLevelNewFunction.Item(j).ContextSpecificBodyPtrId);
                if (this->m_marks.IsMarked(body))
                {
                    liveTopLevelBodies.Add(body);
                    this->m_marks.ClearMark(body);
                }
            }

            for (int32 j = 0; j < topLevelEval.Count(); ++j)
            {
                Js::FunctionBody* body = TTD_COERCE_PTR_ID_TO_FUNCTIONBODY(topLevelEval.Item(j).ContextSpecificBodyPtrId);
                if (this->m_marks.IsMarked(body))
                {
                    liveTopLevelBodies.Add(body);
                    this->m_marks.ClearMark(body);
                }
            }
        }

        UnorderedArrayList<NSSnapValues::SnapContext, TTD_ARRAY_LIST_SIZE_XSMALL>& snpCtxs = this->m_pendingSnap->GetContextList();
        for(int32 i = 0; i < threadContext->TTDContext->GetTTDContexts().Count(); ++i)
        {
            NSSnapValues::SnapContext* snpCtx = snpCtxs.NextOpenEntry();
            NSSnapValues::ExtractScriptContext(snpCtx, threadContext->TTDContext->GetTTDContexts().Item(i), objToLogIdMap, liveTopLevelBodies, snap->GetSnapshotSlabAllocator());
        }

        //extract the thread context symbol map info
        JsUtil::BaseDictionary<Js::HashedCharacterBuffer<char16>*, const Js::PropertyRecord*, Recycler, PowerOf2SizePolicy, Js::PropertyRecordStringHashComparer>* tcSymbolRegistrationMap = threadContext->GetSymbolRegistrationMap_TTD();
        UnorderedArrayList<Js::PropertyId, TTD_ARRAY_LIST_SIZE_XSMALL>& tcSymbolMapInfo = this->m_pendingSnap->GetTCSymbolMapInfoList();
        for(auto iter = tcSymbolRegistrationMap->GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            Js::PropertyId* tcpid = tcSymbolMapInfo.NextOpenEntry();
            *tcpid = iter.CurrentValue()->GetPropertyId();
        }

        this->m_idToHandlerMap.Initialize(this->m_marks.GetCountForTag<MarkTableTag::TypeHandlerTag>());
        this->m_idToTypeMap.Initialize(this->m_marks.GetCountForTag<MarkTableTag::TypeTag>());

        //walk all the marked objects
        this->m_marks.InitializeIter();
        MarkTableTag tag = this->m_marks.GetTagValue();
        while(tag != MarkTableTag::Clear)
        {
            switch(tag & MarkTableTag::AllKindMask)
            {
            case MarkTableTag::TypeHandlerTag:
                this->ExtractHandlerIfNeeded(this->m_marks.GetPtrValue<Js::DynamicTypeHandler*>(), threadContext);
                break;
            case MarkTableTag::TypeTag:
                this->ExtractTypeIfNeeded(this->m_marks.GetPtrValue<Js::Type*>(), threadContext);
                break;
            case MarkTableTag::PrimitiveObjectTag:
            {
                this->ExtractTypeIfNeeded(this->m_marks.GetPtrValue<Js::RecyclableObject*>()->GetType(), threadContext);
                NSSnapValues::ExtractSnapPrimitiveValue(snap->GetNextAvailablePrimitiveObjectEntry(), this->m_marks.GetPtrValue<Js::RecyclableObject*>(), this->m_marks.GetTagValueIsWellKnown(), this->m_idToTypeMap, alloc);
                break;
            }
            case MarkTableTag::CompoundObjectTag:
            {
                this->ExtractTypeIfNeeded(this->m_marks.GetPtrValue<Js::RecyclableObject*>()->GetType(), threadContext);
                if(Js::VarIs<Js::ScriptFunction>(this->m_marks.GetPtrValue<Js::RecyclableObject*>()))
                {
                    this->ExtractScriptFunctionEnvironmentIfNeeded(this->m_marks.GetPtrValue<Js::ScriptFunction*>());
                }
                NSSnapObjects::ExtractCompoundObject(snap->GetNextAvailableCompoundObjectEntry(), this->m_marks.GetPtrValue<Js::RecyclableObject*>(), this->m_marks.GetTagValueIsWellKnown(), this->m_idToTypeMap, alloc);
                break;
            }
            case MarkTableTag::FunctionBodyTag:
                NSSnapValues::ExtractFunctionBodyInfo(snap->GetNextAvailableFunctionBodyResolveInfoEntry(), this->m_marks.GetPtrValue<Js::FunctionBody*>(), this->m_marks.GetTagValueIsWellKnown(), alloc);
                break;
            case MarkTableTag::EnvironmentTag:
            case MarkTableTag::SlotArrayTag:
                break; //should be handled with the associated script function
            default:
                TTDAssert(false, "If this isn't true then we have an unknown tag");
                break;
            }

            this->m_marks.MoveToNextAddress();
            tag = this->m_marks.GetTagValue();
        }

        //Extract the roots
        ThreadContextTTD* txctx = threadContext->TTDContext;
        UnorderedArrayList<NSSnapValues::SnapRootInfoEntry, TTD_ARRAY_LIST_SIZE_MID>& rootlist = this->m_pendingSnap->GetRootList();
        for(auto iter = threadContext->TTDContext->GetRootTagToObjectMap().GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            NSSnapValues::SnapRootInfoEntry* spe = rootlist.NextOpenEntry();
            spe->LogObject = TTD_CONVERT_VAR_TO_PTR_ID(iter.CurrentValue());
            spe->LogId = iter.CurrentKey();
            spe->MaybeLongLivedRoot = txctx->ResolveIsLongLivedForExtract(spe->LogId);
        }

        if(threadContext->TTDContext->GetActiveScriptContext() == nullptr)
        {
            this->m_pendingSnap->SetActiveScriptContext(TTD_INVALID_LOG_PTR_ID);
        }
        else
        {
            TTD_LOG_PTR_ID ctxId = threadContext->TTDContext->GetActiveScriptContext()->ScriptContextLogTag;
            this->m_pendingSnap->SetActiveScriptContext(ctxId);
        }

        double endTime = timer.Now();
        snap->ExtractTime = (endTime - startTime) / 1000.0;
    }